

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fb.h
# Opt level: O0

ssize_t fb_fls(fb_group_t *fb,size_t nbits,size_t max_bit)

{
  uint uVar1;
  ulong in_RDX;
  long in_RDI;
  size_t pos;
  size_t bit;
  ssize_t group_ind_bound;
  fb_group_t group;
  fb_group_t maybe_invert;
  size_t bit_ind;
  ssize_t group_ind;
  size_t ngroups;
  ulong local_50;
  ulong local_38;
  
  local_38 = in_RDX >> 6;
  local_50 = (2L << ((byte)in_RDX & 0x3f)) - 1U & *(ulong *)(in_RDI + local_38 * 8);
  while( true ) {
    if (local_50 != 0) {
      uVar1 = fls_lu(local_50);
      return local_38 * 0x40 + (ulong)uVar1;
    }
    local_38 = local_38 - 1;
    if (local_38 == 0xffffffffffffffff) break;
    local_50 = *(unsigned_long *)(in_RDI + local_38 * 8);
  }
  return -1;
}

Assistant:

static inline ssize_t
fb_fls(fb_group_t *fb, size_t nbits, size_t max_bit) {
	return fb_find_impl(fb, nbits, max_bit, /* val */ true,
	    /* forward */ false);
}